

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void parseThreeCommaList<double>(string *lst,double *a,double *b,double *c)

{
  runtime_error *this;
  long *plVar1;
  long *plVar2;
  vector<double,_std::allocator<double>_> vec;
  double v;
  string part;
  istringstream ssp;
  istringstream ss;
  double *local_3c8;
  iterator iStack_3c0;
  double *local_3b8;
  double *local_3b0;
  double *local_3a8;
  double *local_3a0;
  double local_398;
  undefined1 *local_390;
  undefined8 local_388;
  undefined1 local_380;
  undefined7 uStack_37f;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  long *local_330;
  long local_328;
  long local_320;
  long lStack_318;
  ios_base local_2b8 [264];
  long local_1b0 [4];
  int aiStack_190 [22];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)lst,_S_in);
  local_390 = &local_380;
  local_388 = 0;
  local_380 = 0;
  local_3b8 = (double *)0x0;
  local_3c8 = (double *)0x0;
  iStack_3c0._M_current = (double *)0x0;
  if (*(int *)((long)aiStack_190 + *(long *)(local_1b0[0] + -0x18)) == 0) {
    local_3b0 = a;
    local_3a8 = b;
    local_3a0 = c;
    do {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_1b0,(string *)&local_390,',');
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&local_330,(string *)&local_390,_S_in);
      std::istream::_M_extract<double>((double *)&local_330);
      if (iStack_3c0._M_current == local_3b8) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double&>
                  ((vector<double,std::allocator<double>> *)&local_3c8,iStack_3c0,&local_398);
      }
      else {
        *iStack_3c0._M_current = local_398;
        iStack_3c0._M_current = iStack_3c0._M_current + 1;
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_330);
      std::ios_base::~ios_base(local_2b8);
      b = local_3a8;
      a = local_3b0;
      c = local_3a0;
    } while (*(int *)((long)aiStack_190 + *(long *)(local_1b0[0] + -0x18)) == 0);
  }
  if ((long)iStack_3c0._M_current - (long)local_3c8 != 0x18) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_370,(long)iStack_3c0._M_current - (long)local_3c8 >> 3);
    std::operator+(&local_350,"Error: Input vector was ",&local_370);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_350);
    local_330 = (long *)*plVar1;
    plVar2 = plVar1 + 2;
    if (local_330 == plVar2) {
      local_320 = *plVar2;
      lStack_318 = plVar1[3];
      local_330 = &local_320;
    }
    else {
      local_320 = *plVar2;
    }
    local_328 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::runtime_error::runtime_error(this,(string *)&local_330);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *a = *local_3c8;
  *b = local_3c8[1];
  *c = local_3c8[2];
  operator_delete(local_3c8,(long)local_3b8 - (long)local_3c8);
  if (local_390 != &local_380) {
    operator_delete(local_390,CONCAT71(uStack_37f,local_380) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void parseThreeCommaList(std::string lst, T& a, T& b, T& c)
{
    std::istringstream ss(lst);
    std::string part;
    T v;
    std::vector<T> vec;
    while(ss.good()) {
        getline( ss, part, ',' );
//        vec.emplace_back(std::stoi(part));
        std::istringstream ssp(part);
        ssp >> v;
        vec.emplace_back(v);
    }

    if (vec.size() != 3)
        throw std::runtime_error("Error: Input vector was " + std::to_string(vec.size()) + ", expected 3.");

    a = vec[0];
    b = vec[1];
    c = vec[2];
}